

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

complex<float> csign1(complex<float> z1,complex<float> z2)

{
  complex<float> z;
  float fVar1;
  _ComplexT_conflict in_XMM0_Qa;
  _ComplexT_conflict extraout_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  float local_54;
  complex<float> local_50;
  _ComplexT_conflict local_48;
  float local_3c [3];
  complex<float> local_30;
  _ComplexT_conflict local_28;
  complex<float> local_20;
  complex<float> z2_local;
  complex<float> z1_local;
  complex<float> value;
  
  local_20._M_value = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  z._M_value = (_ComplexT_conflict)&z1_local;
  z2_local._M_value = in_XMM0_Qa;
  std::complex<float>::complex((complex<float> *)z._M_value,0.0,0.0);
  local_28 = local_20._M_value;
  fVar1 = cabs1(z);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    local_48 = z2_local._M_value;
    local_3c[0] = cabs1(z);
    local_54 = cabs1(z);
    std::operator/(&local_20,&local_54);
    std::operator*(local_3c,&local_50);
    local_30._M_value = extraout_XMM0_Qa;
  }
  else {
    std::complex<float>::complex(&local_30,0.0,0.0);
  }
  return (complex<float>)local_30._M_value;
}

Assistant:

complex <float> csign1 ( complex <float> z1, complex <float> z2 )

//****************************************************************************80
//
//  Purpose:
//
//    CSIGN1 is a transfer-of-sign function.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    The L1 norm is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, complex <float> Z1, Z2, the arguments.
//
//    Output, complex <float> CSIGN1,  a complex value, with the magnitude of
//    Z1, and the argument of Z2.
//
{
  complex <float> value;

  if ( cabs1 ( z2 ) == 0.0 )
  {
    value = complex <float> ( 0.0, 0.0 );
  }
  else
  {
    value = cabs1 ( z1 ) * ( z2 / cabs1 ( z2 ) );
  }

  return value;
}